

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O0

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* Tile<Color>::generate_action_map(Symmetry *symmetry)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RDI;
  Symmetry *in_stack_00000038;
  size_t i_3;
  size_t a_1;
  size_t i_2;
  size_t i_1;
  size_t a;
  size_t i;
  size_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reflection_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rotation_map;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *action_map;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  allocator_type *in_stack_ffffffffffffff30;
  value_type *__value;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this;
  size_type local_a0;
  ulong local_98;
  size_type local_90;
  size_type local_88;
  ulong local_80;
  size_type local_78;
  value_type local_6a;
  undefined1 local_49;
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  Symmetry *in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  generate_rotation_map(in_stack_ffffffffffffffe8);
  generate_reflection_map(in_stack_00000038);
  local_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffd8);
  local_49 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x149479);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(size_type)in_RDI,
             in_stack_ffffffffffffff30);
  __value = &local_6a;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x1494a1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(this,(size_type)in_RDI,__value,
           (allocator_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x1494c9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__value);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1494e0);
  for (local_78 = 0; local_78 < local_48; local_78 = local_78 + 1) {
    vVar1 = (value_type)local_78;
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](in_RDI,0);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_78);
    *pvVar3 = vVar1;
  }
  for (local_80 = 1; local_80 < 4; local_80 = local_80 + 1) {
    for (local_88 = 0; local_88 < local_48; local_88 = local_88 + 1) {
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](in_RDI,local_80 - 1);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_88)
      ;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &stack0xffffffffffffffd8,(ulong)*pvVar3);
      vVar1 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](in_RDI,local_80);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_88)
      ;
      *pvVar3 = vVar1;
    }
  }
  for (local_90 = 0; local_90 < local_48; local_90 = local_90 + 1) {
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](in_RDI,0);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_90);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_40,(ulong)*pvVar3);
    vVar1 = *pvVar3;
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](in_RDI,4);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_90);
    *pvVar3 = vVar1;
  }
  for (local_98 = 5; local_98 < 8; local_98 = local_98 + 1) {
    for (local_a0 = 0; local_a0 < local_48; local_a0 = local_a0 + 1) {
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](in_RDI,local_98 - 1);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_a0)
      ;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &stack0xffffffffffffffd8,(ulong)*pvVar3);
      vVar1 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](in_RDI,local_98);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar2,local_a0)
      ;
      *pvVar3 = vVar1;
    }
  }
  local_49 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__value);
  return this;
}

Assistant:

static std::vector<std::vector<unsigned>>
		generate_action_map(const Symmetry &symmetry) noexcept {
		std::vector<unsigned> rotation_map = generate_rotation_map(symmetry);
		std::vector<unsigned> reflection_map = generate_reflection_map(symmetry);
		size_t size = rotation_map.size();
		std::vector<std::vector<unsigned>> action_map(8,
			std::vector<unsigned>(size));
		for (size_t i = 0; i < size; ++i) {
			action_map[0][i] = i;
		}

		for (size_t a = 1; a < 4; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		for (size_t i = 0; i < size; ++i) {
			action_map[4][i] = reflection_map[action_map[0][i]];
		}
		for (size_t a = 5; a < 8; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		return action_map;
	}